

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void computeLimitRegisters(Parse *pParse,Select *p,int iBreak)

{
  Expr *pExpr;
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  Vdbe *p_00;
  int target;
  int iVar3;
  int n;
  
  n = (int)((ulong)in_RAX >> 0x20);
  if (p->iLimit != 0) {
    return;
  }
  sqlite3ExprCacheClear(pParse);
  if (p->pLimit == (Expr *)0x0) {
    return;
  }
  target = pParse->nMem + 1;
  pParse->nMem = target;
  p->iLimit = target;
  p_00 = sqlite3GetVdbe(pParse);
  if (p_00 == (Vdbe *)0x0) {
    return;
  }
  iVar1 = sqlite3ExprIsInteger(p->pLimit,&n);
  if (iVar1 == 0) {
    sqlite3ExprCode(pParse,p->pLimit,target);
    sqlite3VdbeAddOp1(p_00,0x15,target);
    iVar1 = 0x7a;
    iVar3 = target;
  }
  else {
    sqlite3VdbeAddOp2(p_00,7,n,target);
    if (n != 0) {
      if ((double)n < p->nSelectRow) {
        p->nSelectRow = (double)n;
      }
      goto LAB_00172c23;
    }
    iVar1 = 1;
    iVar3 = 0;
  }
  sqlite3VdbeAddOp2(p_00,iVar1,iVar3,iBreak);
LAB_00172c23:
  pExpr = p->pOffset;
  if (pExpr != (Expr *)0x0) {
    iVar3 = pParse->nMem;
    iVar1 = iVar3 + 1;
    p->iOffset = iVar1;
    iVar3 = iVar3 + 2;
    pParse->nMem = iVar3;
    sqlite3ExprCode(pParse,pExpr,iVar1);
    sqlite3VdbeAddOp1(p_00,0x15,iVar1);
    uVar2 = sqlite3VdbeAddOp1(p_00,0x78,iVar1);
    sqlite3VdbeAddOp2(p_00,7,0,iVar1);
    if ((-1 < (int)uVar2) && (uVar2 < (uint)p_00->nOp)) {
      p_00->aOp[uVar2].p2 = p_00->nOp;
    }
    sqlite3VdbeAddOp3(p_00,0x56,target,iVar1,iVar3);
    uVar2 = sqlite3VdbeAddOp1(p_00,0x78,target);
    sqlite3VdbeAddOp2(p_00,7,-1,iVar3);
    if ((-1 < (int)uVar2) && (uVar2 < (uint)p_00->nOp)) {
      p_00->aOp[uVar2].p2 = p_00->nOp;
    }
  }
  return;
}

Assistant:

static void computeLimitRegisters(Parse *pParse, Select *p, int iBreak){
  Vdbe *v = 0;
  int iLimit = 0;
  int iOffset;
  int addr1, n;
  if( p->iLimit ) return;

  /* 
  ** "LIMIT -1" always shows all rows.  There is some
  ** contraversy about what the correct behavior should be.
  ** The current implementation interprets "LIMIT 0" to mean
  ** no rows.
  */
  sqlite3ExprCacheClear(pParse);
  assert( p->pOffset==0 || p->pLimit!=0 );
  if( p->pLimit ){
    p->iLimit = iLimit = ++pParse->nMem;
    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;  /* VDBE should have already been allocated */
    if( sqlite3ExprIsInteger(p->pLimit, &n) ){
      sqlite3VdbeAddOp2(v, OP_Integer, n, iLimit);
      VdbeComment((v, "LIMIT counter"));
      if( n==0 ){
        sqlite3VdbeAddOp2(v, OP_Goto, 0, iBreak);
      }else{
        if( p->nSelectRow > (double)n ) p->nSelectRow = (double)n;
      }
    }else{
      sqlite3ExprCode(pParse, p->pLimit, iLimit);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iLimit);
      VdbeComment((v, "LIMIT counter"));
      sqlite3VdbeAddOp2(v, OP_IfZero, iLimit, iBreak);
    }
    if( p->pOffset ){
      p->iOffset = iOffset = ++pParse->nMem;
      pParse->nMem++;   /* Allocate an extra register for limit+offset */
      sqlite3ExprCode(pParse, p->pOffset, iOffset);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iOffset);
      VdbeComment((v, "OFFSET counter"));
      addr1 = sqlite3VdbeAddOp1(v, OP_IfPos, iOffset);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, iOffset);
      sqlite3VdbeJumpHere(v, addr1);
      sqlite3VdbeAddOp3(v, OP_Add, iLimit, iOffset, iOffset+1);
      VdbeComment((v, "LIMIT+OFFSET"));
      addr1 = sqlite3VdbeAddOp1(v, OP_IfPos, iLimit);
      sqlite3VdbeAddOp2(v, OP_Integer, -1, iOffset+1);
      sqlite3VdbeJumpHere(v, addr1);
    }
  }
}